

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O3

bool __thiscall SQInstance::Set(SQInstance *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  uint uVar3;
  SQObjectType SVar4;
  long *plVar5;
  SQTable *pSVar6;
  bool bVar7;
  ulong uVar8;
  SQObjectPtr idx;
  SQObjectPtr local_20;
  
  local_20.super_SQObject._type = OT_NULL;
  local_20.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar7 = SQTable::Get(this->_class->_members,key,&local_20);
  if ((bVar7) && ((local_20.super_SQObject._unVal._0_4_ >> 0x19 & 1) != 0)) {
    uVar8 = (ulong)((local_20.super_SQObject._unVal._0_4_ & 0xffffff) << 4);
    uVar3 = *(uint *)((long)&this->_values[0].super_SQObject._type + uVar8);
    plVar5 = *(long **)((long)&this->_values[0].super_SQObject._unVal + uVar8);
    pSVar6 = (val->super_SQObject)._unVal.pTable;
    *(SQTable **)((long)&this->_values[0].super_SQObject._unVal + uVar8) = pSVar6;
    SVar4 = (val->super_SQObject)._type;
    *(SQObjectType *)((long)&this->_values[0].super_SQObject._type + uVar8) = SVar4;
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    bVar7 = true;
    if ((uVar3 >> 0x1b & 1) != 0) {
      plVar2 = plVar5 + 1;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (**(code **)(*plVar5 + 0x10))();
      }
    }
  }
  else {
    bVar7 = false;
  }
  SQObjectPtr::~SQObjectPtr(&local_20);
  return bVar7;
}

Assistant:

bool Set(const SQObjectPtr &key,const SQObjectPtr &val) {
        SQObjectPtr idx;
        if(_class->_members->Get(key,idx) && _isfield(idx)) {
            _values[_member_idx(idx)] = val;
            return true;
        }
        return false;
    }